

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O1

bool __thiscall indk::Event::doWait(Event *this)

{
  bool bVar1;
  unique_lock<std::mutex> oNotifierLock;
  unique_lock<std::mutex> local_30;
  
  local_30._M_owns = false;
  local_30._M_device = &this->m_oMutex;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  std::condition_variable::wait((unique_lock *)&this->m_oConditionVariable);
  bVar1 = this->m_bEvent;
  this->m_bEvent = false;
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return bVar1;
}

Assistant:

bool indk::Event::doWait() {
    bool bRet;
    std::unique_lock<std::mutex> oNotifierLock(m_oMutex);
    m_oConditionVariable.wait(oNotifierLock);
    bRet = m_bEvent;
    m_bEvent = false;
    return bRet;
}